

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

Wlc_Ntk_t * Wlc_ReadVer(char *pFileName)

{
  Wlc_Ntk_t *p;
  int iVar1;
  Wlc_Prs_t *p_00;
  Wlc_Ntk_t *pNew;
  
  p_00 = Wlc_PrsStart(pFileName);
  if (p_00 != (Wlc_Prs_t *)0x0) {
    iVar1 = Wlc_PrsPrepare(p_00);
    if ((iVar1 == 0) || (iVar1 = Wlc_PrsDerive(p_00), iVar1 == 0)) {
      pNew = (Wlc_Ntk_t *)0x0;
    }
    else {
      p = p_00->pNtk;
      pNew = Wlc_NtkDupDfs(p);
      Wlc_NtkTransferNames(pNew,p);
    }
    if (p_00->sError[0] != '\0') {
      fputs(p_00->sError,_stdout);
    }
    Wlc_PrsStop(p_00);
    return pNew;
  }
  return (Wlc_Ntk_t *)0x0;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadVer( char * pFileName )
{
    Wlc_Prs_t * p;
    Wlc_Ntk_t * pNtk = NULL;
    // start the parser 
    p = Wlc_PrsStart( pFileName );
    if ( p == NULL )
        return NULL;
    // detect lines
    if ( !Wlc_PrsPrepare( p ) )
        goto finish;
    // parse models
    if ( !Wlc_PrsDerive( p ) )
        goto finish;
    // derive topological order
    pNtk = Wlc_NtkDupDfs( p->pNtk );
    Wlc_NtkTransferNames( pNtk, p->pNtk );
finish:
    Wlc_PrsPrintErrorMessage( p );
    Wlc_PrsStop( p );
    return pNtk;
}